

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError Pa_Initialize(void)

{
  PaUtilHostApiRepresentation **ppPVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  PaUtilHostApiRepresentation *pPVar5;
  long lVar6;
  PaError PVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  if (initializationCount_ == 0) {
    PaUtil_InitializeClock();
    uVar8 = 0xffffffffffffffff;
    lVar9 = -0x100000000;
    do {
      lVar9 = lVar9 + 0x100000000;
      lVar6 = uVar8 + 1;
      uVar8 = uVar8 + 1;
    } while (paHostApiInitializers[lVar6] != (PaUtilHostApiInitializer *)0x0);
    hostApis_ = (PaUtilHostApiRepresentation **)PaUtil_AllocateMemory(lVar9 >> 0x1d);
    if (hostApis_ == (PaUtilHostApiRepresentation **)0x0) {
      PVar7 = -0x2708;
LAB_00109abc:
      TerminateHostApis();
    }
    else {
      iVar11 = 0;
      hostApisCount_ = 0;
      defaultHostApiIndex_ = -1;
      deviceCount_ = 0;
      if (uVar8 != 0) {
        uVar10 = 1;
        if (1 < (int)uVar8) {
          uVar10 = uVar8 & 0xffffffff;
        }
        uVar8 = 0;
        do {
          iVar2 = hostApisCount_;
          ppPVar1 = hostApis_ + hostApisCount_;
          *ppPVar1 = (PaUtilHostApiRepresentation *)0x0;
          PVar7 = (*paHostApiInitializers[uVar8])(ppPVar1,iVar2);
          if (PVar7 != 0) goto LAB_00109abc;
          pPVar5 = hostApis_[hostApisCount_];
          if (pPVar5 != (PaUtilHostApiRepresentation *)0x0) {
            iVar2 = (pPVar5->info).deviceCount;
            uVar3 = (pPVar5->info).defaultInputDevice;
            if (iVar2 <= (int)uVar3) {
              __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/common/pa_front.c"
                            ,0xeb,"PaError InitializeHostApis(void)");
            }
            uVar4 = (pPVar5->info).defaultOutputDevice;
            if (iVar2 <= (int)uVar4) {
              __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/common/pa_front.c"
                            ,0xec,"PaError InitializeHostApis(void)");
            }
            if (((uVar4 & uVar3) != 0xffffffff) && (defaultHostApiIndex_ == -1)) {
              defaultHostApiIndex_ = hostApisCount_;
            }
            (pPVar5->privatePaFrontInfo).baseDeviceIndex = (long)iVar11;
            if (uVar3 != 0xffffffff) {
              (pPVar5->info).defaultInputDevice = uVar3 + iVar11;
            }
            if (uVar4 != 0xffffffff) {
              (pPVar5->info).defaultOutputDevice = uVar4 + iVar11;
            }
            deviceCount_ = deviceCount_ + iVar2;
            iVar11 = iVar11 + iVar2;
            hostApisCount_ = hostApisCount_ + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
      }
      PVar7 = 0;
      if (defaultHostApiIndex_ == -1) {
        defaultHostApiIndex_ = 0;
      }
    }
    if (PVar7 != 0) {
      return PVar7;
    }
  }
  initializationCount_ = initializationCount_ + 1;
  return 0;
}

Assistant:

PaError Pa_Initialize( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Initialize" );

    if( PA_IS_INITIALISED_ )
    {
        ++initializationCount_;
        result = paNoError;
    }
    else
    {
        PA_VALIDATE_TYPE_SIZES;
        PA_VALIDATE_ENDIANNESS;

        PaUtil_InitializeClock();
        PaUtil_ResetTraceMessages();

        result = InitializeHostApis();
        if( result == paNoError )
            ++initializationCount_;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Initialize", result );

    return result;
}